

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int,_char,_char,_char> *
__thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int,char_const,char,char>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int,_char,_char,_char>
           *__return_storage_ptr__,v10 *this,int *args,char *args_1,char *args_2,char *args_3)

{
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_char_3;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  longlong local_f8;
  size_t local_f0;
  longlong local_b8;
  size_t local_b0;
  longlong local_98;
  size_t local_90;
  longlong local_78;
  size_t local_70;
  char *args_local_3;
  char *args_local_2;
  char *args_local_1;
  int *args_local;
  
  local_f8._0_4_ = *(undefined4 *)this;
  local_b8._0_1_ = (char)*args;
  local_78._0_1_ = *args_1;
  local_98._0_1_ = *args_2;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = local_f8;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_f0;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_b8;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_b0;
  (__return_storage_ptr__->data_).args_[2].field_0.long_long_value = local_78;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_70;
  (__return_storage_ptr__->data_).args_[3].field_0.long_long_value = local_98;
  (__return_storage_ptr__->data_).args_[3].field_0.string.size = local_90;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}